

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O2

int SetApproximateSampleRate(snd_pcm_t *pcm,snd_pcm_hw_params_t *hwParams,double sampleRate)

{
  int iVar1;
  int iVar2;
  pthread_t __thread1;
  char *pcVar3;
  int iVar4;
  uint uVar5;
  char *local_48;
  int _dir;
  uint _max;
  uint _min;
  uint setRate;
  
  if ((pcm == (snd_pcm_t *)0x0) || (hwParams == (snd_pcm_hw_params_t *)0x0)) {
    __assert_fail("pcm && hwParams",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c"
                  ,0xc77,"int SetApproximateSampleRate(snd_pcm_t *, snd_pcm_hw_params_t *, double)")
    ;
  }
  uVar5 = (uint)(long)sampleRate;
  setRate = uVar5;
  iVar1 = snd_pcm_hw_params_set_rate_near(pcm,hwParams,&setRate,0);
  if (-1 < iVar1) {
    iVar2 = setRate - uVar5;
    iVar1 = 0;
    if (iVar2 != 0) {
      iVar4 = -iVar2;
      if (0 < iVar2) {
        iVar4 = iVar2;
      }
      iVar1 = -0x270d;
      if ((uint)(iVar4 * 100) <= uVar5) {
        iVar1 = 0;
      }
    }
    return iVar1;
  }
  __thread1 = pthread_self();
  iVar2 = pthread_equal(__thread1,paUnixMainThread);
  if (iVar2 != 0) {
    pcVar3 = (char *)snd_strerror(iVar1);
    PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar1,pcVar3);
  }
  PaUtil_DebugPrint(
                   "Expression \'alsa_snd_pcm_hw_params_set_rate_near( pcm, hwParams, &setRate, NULL )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 3196\n"
                   );
  do {
    _min = 0;
    _max = 0;
    _dir = 0;
    iVar1 = snd_pcm_hw_params_get_rate_min(hwParams,&_min,&_dir);
    if (iVar1 < 0) {
      iVar2 = pthread_equal(__thread1,paUnixMainThread);
      local_48 = 
      "Expression \'alsa_snd_pcm_hw_params_get_rate_min( hwParams, &_min, &_dir )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 3211\n"
      ;
      if (iVar2 != 0) {
        local_48 = 
        "Expression \'alsa_snd_pcm_hw_params_get_rate_min( hwParams, &_min, &_dir )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 3211\n"
        ;
        goto LAB_0010a86a;
      }
    }
    else {
      iVar1 = snd_pcm_hw_params_get_rate_max(hwParams,&_max,&_dir);
      if (-1 < iVar1) {
        return -9999;
      }
      iVar2 = pthread_equal(__thread1,paUnixMainThread);
      local_48 = 
      "Expression \'alsa_snd_pcm_hw_params_get_rate_max( hwParams, &_max, &_dir )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 3212\n"
      ;
      if (iVar2 != 0) {
        local_48 = 
        "Expression \'alsa_snd_pcm_hw_params_get_rate_max( hwParams, &_max, &_dir )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 3212\n"
        ;
LAB_0010a86a:
        pcVar3 = (char *)snd_strerror(iVar1);
        PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar1,pcVar3);
      }
    }
    PaUtil_DebugPrint(local_48);
  } while( true );
}

Assistant:

static int SetApproximateSampleRate( snd_pcm_t *pcm, snd_pcm_hw_params_t *hwParams, double sampleRate )
{
    PaError result = paNoError;
    unsigned int reqRate, setRate, deviation;

    assert( pcm && hwParams );

    /* The Alsa sample rate is set by integer value; also the actual rate may differ */
    reqRate = setRate = (unsigned int) sampleRate;

    ENSURE_( alsa_snd_pcm_hw_params_set_rate_near( pcm, hwParams, &setRate, NULL ), paUnanticipatedHostError );
    /* The value actually set will be put in 'setRate' (may be way off); check the deviation as a proportion
     * of the requested-rate with reference to the max-deviate-ratio (larger values allow less deviation) */
    deviation = abs( setRate - reqRate );
    if( deviation > 0 && deviation * RATE_MAX_DEVIATE_RATIO > reqRate )
        result = paInvalidSampleRate;

end:
    return result;

error:
    /* Log */
    {
        unsigned int _min = 0, _max = 0;
        int _dir = 0;
        ENSURE_( alsa_snd_pcm_hw_params_get_rate_min( hwParams, &_min, &_dir ), paUnanticipatedHostError );
        ENSURE_( alsa_snd_pcm_hw_params_get_rate_max( hwParams, &_max, &_dir ), paUnanticipatedHostError );
        PA_DEBUG(( "%s: SR min = %u, max = %u, req = %u\n", __FUNCTION__, _min, _max, reqRate ));
    }
    goto end;
}